

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Equiv3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Ssw_RarPars_t Pars;
  
  Ssw_RarSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_00215914:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FWBRSNTmxlvh");
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00215b4e:
        Abc_Print(-1,pcVar3);
        goto switchD_0021596d_caseD_4f;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRandSeed = iVar1;
      break;
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x55:
    case 0x56:
      goto switchD_0021596d_caseD_4f;
    case 0x52:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00215b4e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRounds = iVar1;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00215b4e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRestart = iVar1;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_00215b4e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.TimeOut = iVar1;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_00215b4e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
      break;
    default:
      if (iVar1 == 0x42) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_00215b4e;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nBinSize = iVar1;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == 0x6c) {
            Pars.fLatchOnly = Pars.fLatchOnly ^ 1;
          }
          else if (iVar1 == 0x6d) {
            Pars.fMiter = Pars.fMiter ^ 1;
          }
          else if (iVar1 == 0x76) {
            Pars.fVerbose = Pars.fVerbose ^ 1;
          }
          else {
            if (iVar1 != 0x78) {
              if (iVar1 == -1) {
                p = pAbc->pGia;
                if (p != (Gia_Man_t *)0x0) {
                  if (p->nRegs == 0) {
                    pcVar3 = "Abc_CommandAbc9Equiv3(): There is no flops. Nothing is done.\n";
LAB_00215cbb:
                    Abc_Print(0,pcVar3);
                    return 0;
                  }
                  if (Pars.fUseCex != 0) {
                    if (Pars.fMiter != 0) {
                      Abc_Print(0,
                                "Abc_CommandAbc9Equiv3(): Considering the miter as a circuit because the CEX is given.\n"
                               );
                      Pars.fMiter = 0;
                    }
                    Pars.pCex = pAbc->pCex;
                    if (Pars.pCex == (Abc_Cex_t *)0x0) {
                      pcVar3 = "Abc_CommandAbc9Equiv3(): Counter-example is not available.\n";
                      goto LAB_00215cbb;
                    }
                    p = pAbc->pGia;
                    if ((Pars.pCex)->nPis != p->vCis->nSize - p->nRegs) {
                      Abc_Print(-1,
                                "Abc_CommandAbc9Equiv3(): The number of PIs differs in cex (%d) and in AIG (%d).\n"
                               );
                      return 1;
                    }
                  }
                  iVar2 = Ssw_RarSignalFilterGia(p,&Pars);
                  pAbc->Status = iVar2;
                  Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
                  return 0;
                }
                pcVar3 = "Abc_CommandAbc9Equiv3(): There is no AIG.\n";
                iVar2 = -1;
                goto LAB_00215c84;
              }
              goto switchD_0021596d_caseD_4f;
            }
            Pars.fUseCex = Pars.fUseCex ^ 1;
          }
          goto LAB_00215914;
        }
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_00215b4e;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nFrames = iVar1;
      }
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_0021596d_caseD_4f:
      iVar2 = -2;
      Abc_Print(-2,"usage: &equiv3 [-FWRSNT num] [-mxlvh]\n");
      Abc_Print(-2,"\t         computes candidate equivalence classes\n");
      Abc_Print(-2,"\t-F num : the max number of frames for BMC [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-R num : the max number of simulation rounds [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
                (ulong)(uint)Pars.nRestart);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)(uint)Pars.nRandSeed);
      Abc_Print(-2,"\t-T num : runtime limit in seconds for all rounds [default = %d]\n",
                (ulong)(uint)Pars.TimeOut);
      pcVar3 = "miter";
      if (Pars.fMiter == 0) {
        pcVar3 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar3);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (Pars.fUseCex == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle using the current CEX to perform refinement [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (Pars.fLatchOnly == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle considering only latch output equivalences [default = %s]\n",
                pcVar3);
      if (Pars.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
LAB_00215c84:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Equiv3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Ssw_RarSignalFilterGia( Gia_Man_t * p, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTmxlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'x':
            pPars->fUseCex ^= 1;
            break;
        case 'l':
            pPars->fLatchOnly ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Equiv3(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( 0, "Abc_CommandAbc9Equiv3(): There is no flops. Nothing is done.\n" );
        return 0;
    }
    if ( pPars->fUseCex )
    {
        if ( pPars->fMiter )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv3(): Considering the miter as a circuit because the CEX is given.\n" );
            pPars->fMiter = 0;
        }
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv3(): Counter-example is not available.\n" );
            return 0;
        }
        if ( pAbc->pCex->nPis != Gia_ManPiNum(pAbc->pGia) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Equiv3(): The number of PIs differs in cex (%d) and in AIG (%d).\n",
                pAbc->pCex->nPis, Gia_ManPiNum(pAbc->pGia) );
            return 1;
        }
        pPars->pCex = pAbc->pCex;
    }
    pAbc->Status = Ssw_RarSignalFilterGia( pAbc->pGia, pPars );
//    pAbc->nFrames = pAbc->pGia->pCexSeq->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv3 [-FWRSNT num] [-mxlvh]\n" );
    Abc_Print( -2, "\t         computes candidate equivalence classes\n" );
    Abc_Print( -2, "\t-F num : the max number of frames for BMC [default = %d]\n",                   pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",                    pPars->nWords );
    Abc_Print( -2, "\t-R num : the max number of simulation rounds [default = %d]\n",                pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",              pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",              pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : runtime limit in seconds for all rounds [default = %d]\n",            pPars->TimeOut );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n",                       pPars->fMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-x     : toggle using the current CEX to perform refinement [default = %s]\n", pPars->fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle considering only latch output equivalences [default = %s]\n",  pPars->fLatchOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}